

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

Float<unsigned_int,_5,_5,_15,_2U>
tcu::Float<unsigned_int,5,5,15,2u>::convert<unsigned_int,8,23,127,3u>
          (Float<unsigned_int,_8,_23,_127,_3U> *other)

{
  uint uVar1;
  int iVar2;
  StorageType SVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = other->m_value;
  uVar4 = 0;
  if ((((-1 < (int)uVar1) && (uVar4 = 0x3e0, uVar1 != 0x7f800000)) &&
      (uVar4 = 0x3ff, (~uVar1 & 0x7f800000) != 0 || (uVar1 & 0x7fffff) == 0)) &&
     (uVar4 = 0, uVar1 != 0)) {
    iVar2 = Float<unsigned_int,_8,_23,_127,_3U>::exponent(other);
    SVar3 = Float<unsigned_int,_8,_23,_127,_3U>::mantissa(other);
    iVar2 = -iVar2;
    for (uVar5 = (ulong)SVar3; ((uint)uVar5 >> 0x17 & 1) == 0; uVar5 = uVar5 * 2) {
      iVar2 = iVar2 + 1;
    }
    if (-iVar2 < -0xe) {
      if ((uint)-iVar2 < 0xffffffec) {
        uVar4 = other->m_value >> 0x15 & 0x400;
      }
      else {
        uVar4 = (uint)(~(-1L << ((char)iVar2 + 3U & 0x3f)) + uVar5 +
                       (ulong)((uVar5 >> ((ulong)(iVar2 + 4U) & 0x3f) & 1) != 0) >>
                      ((byte)(iVar2 + 4U) & 0x3f));
      }
    }
    else {
      uVar5 = (uVar5 & 0xffffffffff7fffff) + 0x1ffff + (ulong)(((uint)uVar5 >> 0x12 & 1) != 0);
      iVar2 = (((uint)uVar5 & 0x800000) >> 0x17) - iVar2;
      if (iVar2 < 0x10) {
        uVar4 = (uint)(uVar5 >> 0x12);
        if ((uVar5 & 0x800000) != 0) {
          uVar4 = 0;
        }
        uVar4 = uVar4 | iVar2 * 0x20 + 0x1e0U;
      }
      else {
        uVar4 = other->m_value >> 0x15 & 0x400 | 0x3e0;
      }
    }
  }
  return (Float<unsigned_int,_5,_5,_15,_2U>)uVar4;
}

Assistant:

inline int				signBit			(void) const	{ return (int)(m_value >> (ExponentBits+MantissaBits)) & 1;					}